

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLDeclaration * __thiscall tinyxml2::XMLDocument::NewDeclaration(XMLDocument *this,char *str)

{
  XMLNode *this_00;
  char *local_30;
  XMLDeclaration *dec;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = &CreateUnlinkedNode<tinyxml2::XMLDeclaration,104>(this,&this->_commentPool)->
             super_XMLNode;
  local_30 = str;
  if (str == (char *)0x0) {
    local_30 = "xml version=\"1.0\" encoding=\"UTF-8\"";
  }
  XMLNode::SetValue(this_00,local_30,false);
  return (XMLDeclaration *)this_00;
}

Assistant:

XMLDeclaration* XMLDocument::NewDeclaration(const char* str)
{
    XMLDeclaration* dec = CreateUnlinkedNode<XMLDeclaration>(_commentPool);
    dec->SetValue(str ? str : "xml version=\"1.0\" encoding=\"UTF-8\"");
    return dec;
}